

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

bool __thiscall fast_float::bigint::pow5(bigint *this,uint32_t exp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  size_t in_RCX;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t index;
  ulong uVar10;
  ulong uVar11;
  limb_span y;
  
  if (0x86 < exp) {
    do {
      y.length = in_RCX;
      y.ptr = (unsigned_long *)0x5;
      bVar6 = large_mul<(unsigned_short)62>
                        ((fast_float *)this,
                         (stackvec<(unsigned_short)62> *)pow5_tables<void>::large_power_of_5,y);
      if (!bVar6) goto LAB_0012ed5e;
      exp = exp - 0x87;
    } while (0x86 < exp);
  }
  if (0x1a < exp) {
    uVar7 = (this->vec).length;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar10 = 0;
        uVar8 = 0;
        do {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar8;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (this->vec).data[uVar10];
          auVar4 = ZEXT816(0x6765c793fa10079d) * auVar2 + auVar4;
          uVar8 = auVar4._8_8_;
          (this->vec).data[uVar10] = auVar4._0_8_;
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
        if (uVar8 != 0) {
          if (0x3d < uVar7) goto LAB_0012ed5e;
          (this->vec).data[uVar7] = uVar8;
          uVar7 = uVar7 + 1;
          (this->vec).length = uVar7;
        }
      }
      exp = exp - 0x1b;
    } while (0x1a < exp);
  }
  bVar6 = true;
  if (exp != 0) {
    uVar7 = (this->vec).length;
    uVar8 = (ulong)uVar7;
    if (uVar8 != 0) {
      uVar10 = pow5_tables<void>::small_power_of_5[exp];
      uVar11 = 0;
      uVar9 = 0;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar9;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar10;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (this->vec).data[uVar11];
        auVar5 = auVar1 * auVar3 + auVar5;
        uVar9 = auVar5._8_8_;
        (this->vec).data[uVar11] = auVar5._0_8_;
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
      if (uVar9 != 0) {
        if (uVar7 < 0x3e) {
          (this->vec).data[uVar8] = uVar9;
          (this->vec).length = uVar7 + 1;
        }
        else {
LAB_0012ed5e:
          bVar6 = false;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool pow5(uint32_t exp) noexcept {
    // multiply by a power of 5
    size_t large_length = sizeof(large_power_of_5) / sizeof(limb);
    limb_span large = limb_span(large_power_of_5, large_length);
    while (exp >= large_step) {
      FASTFLOAT_TRY(large_mul(vec, large));
      exp -= large_step;
    }
#ifdef FASTFLOAT_64BIT_LIMB
    uint32_t small_step = 27;
    limb max_native = 7450580596923828125UL;
#else
    uint32_t small_step = 13;
    limb max_native = 1220703125U;
#endif
    while (exp >= small_step) {
      FASTFLOAT_TRY(small_mul(vec, max_native));
      exp -= small_step;
    }
    if (exp != 0) {
      // Work around clang bug https://godbolt.org/z/zedh7rrhc
      // This is similar to https://github.com/llvm/llvm-project/issues/47746,
      // except the workaround described there don't work here
      FASTFLOAT_TRY(
        small_mul(vec, limb(((void)small_power_of_5[0], small_power_of_5[exp])))
      );
    }

    return true;
  }